

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twitch_irc.cpp
# Opt level: O3

void __thiscall twitch_irc::handle_connect(twitch_irc *this,error_code *error,iterator *it)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  ostream *poVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  long lVar8;
  basic_resolver_entry<boost::asio::ip::tcp> endpoint;
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  _Alloc_hider local_e8;
  undefined1 local_d8 [16];
  _Alloc_hider local_c8;
  char local_b8 [24];
  element_type *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  pointer local_90;
  data_union local_88;
  bind_t<void,_boost::_mfi::mf2<void,_twitch_irc,_const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>,_boost::_bi::list3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>_>
  local_60;
  
  if (error->failed_ == false) {
    if ((this->on_connect).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar6 = std::__throw_bad_function_call();
      if (local_60.l_.
          super_storage3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>
          .a3_.t_.values_.
          super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.l_.
                   super_storage3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>
                   .a3_.t_.values_.
                   super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
      }
      boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>::~basic_resolver_entry
                ((basic_resolver_entry<boost::asio::ip::tcp> *)local_108);
      _Unwind_Resume(uVar6);
    }
    (*(this->on_connect)._M_invoker)((_Any_data *)&this->on_connect);
    local_108._0_8_ = (streambuf *)auStack_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"\r\n","");
    local_88._0_8_ = &this->read_buffer;
    local_60.f_.f_ = (F)read;
    local_60.f_._8_8_ = 0;
    local_60.l_.
    super_storage3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>
    .super_storage2<boost::_bi::value<twitch_irc_*>,_boost::arg<1>_>.
    super_storage1<boost::_bi::value<twitch_irc_*>_>.a1_.t_ =
         (storage1<boost::_bi::value<twitch_irc_*>_>)
         (storage1<boost::_bi::value<twitch_irc_*>_>)this;
    boost::asio::
    async_read_until<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::_bi::bind_t<void,boost::_mfi::mf1<void,twitch_irc,boost::system::error_code_const&>,boost::_bi::list2<boost::_bi::value<twitch_irc*>,boost::arg<1>>>>
              (&this->socket,(basic_streambuf_ref<std::allocator<char>_> *)&local_88.base,
               (string *)local_108,
               (bind_t<void,_boost::_mfi::mf1<void,_twitch_irc,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<twitch_irc_*>,_boost::arg<1>_>_>
                *)&local_60,(type *)0x0);
    _Var7._M_p = (pointer)local_108._0_8_;
    if ((streambuf *)local_108._0_8_ == (streambuf *)auStack_f8) {
      return;
    }
  }
  else {
    if ((it->values_).
        super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      (*error->cat_->_vptr_error_category[4])(local_108,error->cat_,(ulong)(uint)error->val_);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_108._0_8_,
                          CONCAT44(local_108._12_4_,local_108._8_4_));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      puVar5 = auStack_f8;
      _Var7._M_p = (pointer)local_108._0_8_;
    }
    else {
      boost::asio::
      basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::close(&(this->socket).
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ,(int)error);
      lVar3 = (long)(((it->values_).
                      super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->
                    super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      lVar8 = it->index_ * 0x60;
      plVar2 = (long *)(lVar3 + lVar8);
      local_108._0_8_ = *plVar2;
      local_108._8_4_ = (undefined4)plVar2[1];
      local_108._12_4_ = *(undefined4 *)((long)plVar2 + 0xc);
      lVar1 = lVar3 + 0xc + lVar8;
      auStack_f8._0_4_ = *(undefined4 *)(lVar1 + 4);
      auStack_f8._4_4_ = *(undefined4 *)(lVar1 + 8);
      auStack_f8._8_4_ = *(undefined4 *)(lVar1 + 0xc);
      local_e8._M_p = local_d8;
      lVar1 = *(long *)(lVar3 + 0x20 + lVar8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,lVar1,*(long *)(lVar3 + 0x28 + lVar8) + lVar1);
      lVar1 = *(long *)(lVar3 + 0x40 + lVar8);
      local_c8._M_p = local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,lVar1,*(long *)(lVar3 + 0x48 + lVar8) + lVar1);
      local_88._20_8_ = CONCAT44(auStack_f8._8_4_,auStack_f8._4_4_);
      local_88._16_4_ = auStack_f8._0_4_;
      local_88._0_8_ = local_108._0_8_;
      local_88._8_4_ = local_108._8_4_;
      local_88._12_4_ = local_108._12_4_;
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::increment(it);
      local_a0 = (it->values_).
                 super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      local_98 = (it->values_).
                 super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
      if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_98->_M_use_count = local_98->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_98->_M_use_count = local_98->_M_use_count + 1;
        }
      }
      local_90 = (pointer)it->index_;
      boost::
      bind<void,twitch_irc,boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,twitch_irc*,boost::arg<1>,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>
                (&local_60,(boost *)handle_connect,0,this);
      boost::asio::
      basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::
      async_connect<boost::_bi::bind_t<void,boost::_mfi::mf2<void,twitch_irc,boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>,boost::_bi::list3<boost::_bi::value<twitch_irc*>,boost::arg<1>,boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>>>>
                ((basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)&this->socket,(endpoint_type *)&local_88.base,&local_60);
      if (local_60.l_.
          super_storage3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>
          .a3_.t_.values_.
          super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.l_.
                   super_storage3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>
                   .a3_.t_.values_.
                   super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
      }
      if (local_c8._M_p != local_b8) {
        operator_delete(local_c8._M_p);
      }
      puVar5 = local_d8;
      _Var7._M_p = local_e8._M_p;
    }
    if (_Var7._M_p == puVar5) {
      return;
    }
  }
  operator_delete(_Var7._M_p);
  return;
}

Assistant:

void twitch_irc::handle_connect(const boost::system::error_code &error, tcp::resolver::iterator it)
{
    if (!error) {
        on_connect();
        boost::asio::async_read_until(socket, read_buffer, "\r\n",
                                      bind(&twitch_irc::read, this, _1));
    } else if (it != tcp::resolver::iterator()) {
        socket.close();
        auto endpoint = *it;
        socket.async_connect(endpoint,
                             bind(&twitch_irc::handle_connect, this, _1, ++it));
    } else {
        cerr << error.message() << endl;
    }

}